

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_chunk_append(nni_chunk *ch,void *data,size_t len)

{
  int rv;
  size_t len_local;
  void *data_local;
  nni_chunk *ch_local;
  
  if (len == 0) {
    ch_local._4_4_ = 0;
  }
  else {
    ch_local._4_4_ = nni_chunk_grow(ch,len + ch->ch_len,0);
    if (ch_local._4_4_ == 0) {
      if (ch->ch_ptr == (uint8_t *)0x0) {
        ch->ch_ptr = ch->ch_buf;
      }
      if (data != (void *)0x0) {
        memcpy(ch->ch_ptr + ch->ch_len,data,len);
      }
      ch->ch_len = len + ch->ch_len;
      ch_local._4_4_ = 0;
    }
  }
  return ch_local._4_4_;
}

Assistant:

static int
nni_chunk_append(nni_chunk *ch, const void *data, size_t len)
{
	int rv;

	if (len == 0) {
		return (0);
	}
	if ((rv = nni_chunk_grow(ch, len + ch->ch_len, 0)) != 0) {
		return (rv);
	}
	if (ch->ch_ptr == NULL) {
		ch->ch_ptr = ch->ch_buf;
	}
	if (data != NULL) {
		memcpy(ch->ch_ptr + ch->ch_len, data, len);
	}
	ch->ch_len += len;
	return (0);
}